

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O1

void cfl_subsample_hbd_422_32x8_avx2(uint16_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  ulong uVar1;
  __m256i *row;
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [32];
  
  pauVar2 = (undefined1 (*) [32])(cfl_type + 0x10);
  uVar1 = 0xffffffffffffffc0;
  do {
    auVar3 = vphaddw_avx2(pauVar2[-1],*pauVar2);
    auVar3 = vpermq_avx2(auVar3,0xd8);
    auVar3 = vpsllw_avx2(auVar3,2);
    *(undefined1 (*) [32])((long)output_q3 + uVar1 + 0x40) = auVar3;
    uVar1 = uVar1 + 0x40;
    pauVar2 = (undefined1 (*) [32])(*pauVar2 + (long)input_stride * 2);
  } while (uVar1 < 0x1c0);
  return;
}

Assistant:

static void cfl_luma_subsampling_444_hbd_avx2(const uint16_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;  // Forever 32
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    __m256i top_1 = _mm256_loadu_si256((__m256i *)(input + 16));
    _mm256_storeu_si256(row, _mm256_slli_epi16(top, 3));
    _mm256_storeu_si256(row + 1, _mm256_slli_epi16(top_1, 3));
    input += input_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}